

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileBlock(jx9_gen_state *pGen)

{
  sxu32 nLine_00;
  sxu32 nFirstInstr;
  sxi32 sVar1;
  bool bVar2;
  sxu32 nLine;
  sxi32 rc;
  jx9_gen_state *pGen_local;
  
  if ((pGen->pIn->nType & 0x40) == 0) {
    sVar1 = GenStateCompileChunk(pGen,1);
    if (sVar1 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
LAB_0013a01d:
      while( true ) {
        bVar2 = false;
        if (pGen->pIn < pGen->pEnd) {
          bVar2 = (pGen->pIn->nType & 0x40000) != 0;
        }
        if (!bVar2) break;
        pGen->pIn = pGen->pIn + 1;
      }
      pGen_local._4_4_ = 0;
    }
  }
  else {
    nLine_00 = pGen->pIn->nLine;
    nFirstInstr = jx9VmInstrLength(pGen->pVm);
    sVar1 = GenStateEnterBlock(pGen,0x80,nFirstInstr,(void *)0x0,(GenBlock **)0x0);
    if (sVar1 == 0) {
      pGen->pIn = pGen->pIn + 1;
      do {
        if (pGen->pEnd <= pGen->pIn) {
          jx9GenCompileError(pGen,1,nLine_00,"Missing closing braces \'}\'");
LAB_00139fea:
          GenStateLeaveBlock(pGen,(GenBlock **)0x0);
          goto LAB_0013a01d;
        }
        if ((pGen->pIn->nType & 0x80) != 0) {
          pGen->pIn = pGen->pIn + 1;
          goto LAB_00139fea;
        }
        sVar1 = GenStateCompileChunk(pGen,1);
      } while (sVar1 != -10);
      pGen_local._4_4_ = -10;
    }
    else {
      pGen_local._4_4_ = -10;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileBlock(
	jx9_gen_state *pGen /* Code generator state */
	)
{
	sxi32 rc;
	if( pGen->pIn->nType & JX9_TK_OCB /* '{' */ ){
		sxu32 nLine = pGen->pIn->nLine;
		rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_STD, jx9VmInstrLength(pGen->pVm), 0, 0);
		if( rc != SXRET_OK ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
		/* Compile until we hit the closing braces '}' */
		for(;;){
			if( pGen->pIn >= pGen->pEnd ){
				/* No more token to process. Missing closing braces */
				jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Missing closing braces '}'");
				break;
			}
			if( pGen->pIn->nType & JX9_TK_CCB/*'}'*/ ){
				/* Closing braces found, break immediately*/
				pGen->pIn++;
				break;
			}
			/* Compile a single statement */
			rc = GenStateCompileChunk(&(*pGen),JX9_COMPILE_SINGLE_STMT);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
		}
		GenStateLeaveBlock(&(*pGen), 0);			
	}else{
		/* Compile a single statement */
		rc = GenStateCompileChunk(&(*pGen),JX9_COMPILE_SINGLE_STMT);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	/* Jump trailing semi-colons ';' */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
		pGen->pIn++;
	}
	return SXRET_OK;
}